

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O0

lh__Writer * __thiscall
ASDCP::JP2K::lh__Writer::SetSourceStream
          (lh__Writer *this,PictureDescriptor *PDesc,string *label,Rational LocalEditRate)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  Rational WrappingUL;
  bool bVar4;
  int iVar5;
  ui32_t BytesPerEditUnit;
  byte_t *pbVar6;
  lh__Writer *in_R8;
  Rational local_190;
  UL local_180;
  UL local_160;
  string local_140;
  undefined1 local_120 [104];
  h__WriterState local_b8 [31];
  undefined1 local_39;
  Rational local_38;
  Rational local_30;
  string *label_local;
  PictureDescriptor *PDesc_local;
  lh__Writer *this_local;
  Rational LocalEditRate_local;
  Result_t *result;
  
  lVar2._0_4_ = PDesc->ContainerDuration;
  lVar2._4_4_ = (PDesc->SampleRate).Numerator;
  local_30 = LocalEditRate;
  label_local = label;
  PDesc_local = PDesc;
  LocalEditRate_local = (Rational)this;
  if (lVar2 == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                  ,0x4bb,
                  "ASDCP::Result_t ASDCP::JP2K::lh__Writer::SetSourceStream(const PictureDescriptor &, const std::string &, ASDCP::Rational)"
                 );
  }
  this_local = in_R8;
  bVar4 = MXF::h__WriterState::Test_INIT
                    ((h__WriterState *)(PDesc[1].ExtendedCapabilities.Ccap + 10));
  if (bVar4) {
    Rational::Rational(&local_38,0,0);
    bVar4 = Rational::operator==((Rational *)&this_local,&local_38);
    if (bVar4) {
      this_local = *(lh__Writer **)label_local;
    }
    memcpy(PDesc[3].QuantizationDefault.SPqcd + 0xf2,label_local,0x1d8);
    lVar1._0_4_ = PDesc->ContainerDuration;
    lVar1._4_4_ = (PDesc->SampleRate).Numerator;
    if (lVar1 == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x4c3,
                    "ASDCP::Result_t ASDCP::JP2K::lh__Writer::SetSourceStream(const PictureDescriptor &, const std::string &, ASDCP::Rational)"
                   );
    }
    if (*(long *)(PDesc[1].QuantizationDefault.SPqcd + 0xc2) == 0) {
      __assert_fail("m_EssenceDescriptor",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x4c4,
                    "ASDCP::Result_t ASDCP::JP2K::lh__Writer::SetSourceStream(const PictureDescriptor &, const std::string &, ASDCP::Rational)"
                   );
    }
    if (*(long *)(PDesc[3].QuantizationDefault.SPqcd + 0xea) == 0) {
      __assert_fail("m_EssenceSubDescriptor",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x4c5,
                    "ASDCP::Result_t ASDCP::JP2K::lh__Writer::SetSourceStream(const PictureDescriptor &, const std::string &, ASDCP::Rational)"
                   );
    }
    local_39 = 0;
    JP2K_PDesc_to_MD((ASDCP *)this,(PictureDescriptor *)(PDesc[3].QuantizationDefault.SPqcd + 0xf2),
                     *(Dictionary **)&PDesc->ContainerDuration,
                     *(GenericPictureEssenceDescriptor **)
                      (PDesc[1].QuantizationDefault.SPqcd + 0xc2),
                     *(JPEG2000PictureSubDescriptor **)(PDesc[3].QuantizationDefault.SPqcd + 0xea));
    iVar5 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar5) {
      if (*(uint *)((long)&label_local->field_2 + 4) < 0x801) {
        lVar2 = *(long *)(PDesc[1].QuantizationDefault.SPqcd + 0xc2);
        pbVar6 = Dictionary::ul(*(Dictionary **)&PDesc->ContainerDuration,
                                MDD_JP2KEssenceCompression_2K);
        Kumu::Identifier<16U>::Set((Identifier<16U> *)(lVar2 + 0x210),pbVar6);
        *(undefined2 *)(*(long *)(PDesc[3].QuantizationDefault.SPqcd + 0xea) + 0xa0) = 3;
      }
      else {
        lVar2 = *(long *)(PDesc[1].QuantizationDefault.SPqcd + 0xc2);
        pbVar6 = Dictionary::ul(*(Dictionary **)&PDesc->ContainerDuration,
                                MDD_JP2KEssenceCompression_4K);
        Kumu::Identifier<16U>::Set((Identifier<16U> *)(lVar2 + 0x210),pbVar6);
        *(undefined2 *)(*(long *)(PDesc[3].QuantizationDefault.SPqcd + 0xea) + 0xa0) = 4;
      }
      pbVar6 = Dictionary::ul(*(Dictionary **)&PDesc->ContainerDuration,MDD_JPEG2000Essence);
      uVar3 = *(undefined8 *)(pbVar6 + 8);
      *(undefined8 *)(PDesc[4].QuantizationDefault.SPqcd + 0xf2) = *(undefined8 *)pbVar6;
      *(undefined8 *)(PDesc[4].QuantizationDefault.SPqcd + 0xfa) = uVar3;
      *(undefined1 *)&PDesc[4].ExtendedCapabilities.Pcap = 1;
      MXF::h__WriterState::Goto_READY(local_b8);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b8);
      Kumu::Result_t::~Result_t((Result_t *)local_b8);
    }
    iVar5 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    WrappingUL = local_30;
    if (-1 < iVar5) {
      pbVar6 = Dictionary::ul(*(Dictionary **)&PDesc->ContainerDuration,
                              MDD_MXFGCFUFrameWrappedPictureElement);
      UL::UL((UL *)&local_140,pbVar6);
      UL::UL(&local_160,PDesc[4].QuantizationDefault.SPqcd + 0xf2);
      pbVar6 = Dictionary::ul(*(Dictionary **)&PDesc->ContainerDuration,MDD_PictureDataDef);
      UL::UL(&local_180,pbVar6);
      MXF::Rational::Rational(&local_190,(Rational *)&this_local);
      BytesPerEditUnit =
           derive_timecode_rate_from_edit_rate
                     ((Rational *)(PDesc[3].QuantizationDefault.SPqcd + 0xf2));
      h__ASDCPWriter::WriteASDCPHeader
                ((h__ASDCPWriter *)local_120,(string *)PDesc,(UL *)WrappingUL,&local_140,
                 (UL *)&PICT_DEF_LABEL_abi_cxx11_,&local_160,(Rational *)&local_180,
                 (ui32_t)&local_190,BytesPerEditUnit);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_120);
      Kumu::Result_t::~Result_t((Result_t *)local_120);
      MXF::Rational::~Rational(&local_190);
      UL::~UL(&local_180);
      UL::~UL(&local_160);
      UL::~UL((UL *)&local_140);
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
lh__Writer::SetSourceStream(const PictureDescriptor& PDesc, const std::string& label, ASDCP::Rational LocalEditRate)
{
  assert(m_Dict);
  if ( ! m_State.Test_INIT() )
    return RESULT_STATE;

  if ( LocalEditRate == ASDCP::Rational(0,0) )
    LocalEditRate = PDesc.EditRate;

  m_PDesc = PDesc;
  assert(m_Dict);
  assert(m_EssenceDescriptor);
  assert(m_EssenceSubDescriptor);
  Result_t result = JP2K_PDesc_to_MD(m_PDesc, *m_Dict,
				     *static_cast<ASDCP::MXF::GenericPictureEssenceDescriptor*>(m_EssenceDescriptor),
				     *m_EssenceSubDescriptor);

  if ( ASDCP_SUCCESS(result) )
    {
      if ( PDesc.StoredWidth < 2049 )
	{
	  static_cast<ASDCP::MXF::RGBAEssenceDescriptor*>(m_EssenceDescriptor)->PictureEssenceCoding.Set(m_Dict->ul(MDD_JP2KEssenceCompression_2K));
	  m_EssenceSubDescriptor->Rsize = 3;
	}
      else
	{
	  static_cast<ASDCP::MXF::RGBAEssenceDescriptor*>(m_EssenceDescriptor)->PictureEssenceCoding.Set(m_Dict->ul(MDD_JP2KEssenceCompression_4K));
	  m_EssenceSubDescriptor->Rsize = 4;
	}

      memcpy(m_EssenceUL, m_Dict->ul(MDD_JPEG2000Essence), SMPTE_UL_LENGTH);
      m_EssenceUL[SMPTE_UL_LENGTH-1] = 1; // first (and only) essence container
      result = m_State.Goto_READY();
    }

  if ( ASDCP_SUCCESS(result) )
    {
      result = WriteASDCPHeader(label, UL(m_Dict->ul(MDD_MXFGCFUFrameWrappedPictureElement)),
				PICT_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_PictureDataDef)),
				LocalEditRate, derive_timecode_rate_from_edit_rate(m_PDesc.EditRate));
    }

  return result;
}